

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

string * Capitalize(string *str)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffcf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __str = in_RDI;
  this = in_RSI;
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (bVar2) {
    std::__cxx11::string::string(this,__str);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front(in_RDI);
    cVar3 = ToUpper(in_stack_ffffffffffffffcf);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_RDI,(size_type)in_RSI);
    *pvVar4 = cVar3;
    std::__cxx11::string::string(this,__str);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __str;
  }
  __stack_chk_fail();
}

Assistant:

std::string Capitalize(std::string str)
{
    if (str.empty()) return str;
    str[0] = ToUpper(str.front());
    return str;
}